

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderMatrixTests.cpp
# Opt level: O3

void deqp::gles3::Functional::MatrixCaseUtils::Evaluator<5,_3,_2>::evaluate
               (ShaderEvalContext *evalCtx,InputType in0Type,InputType in1Type)

{
  int i;
  long lVar1;
  Vector<float,_2> *in_RCX;
  ulong uVar2;
  Vector<float,_3> res;
  Type in1;
  undefined8 local_60;
  float local_58 [6];
  int aiStack_40 [6];
  undefined1 local_28 [20];
  float afStack_14 [3];
  
  if (in0Type == INPUTTYPE_DYNAMIC) {
    local_58[0] = (evalCtx->coords).m_data[2];
    local_60 = *(undefined8 *)(evalCtx->coords).m_data;
  }
  else {
    local_60 = 0x3dcccccd3f8ccccd;
    local_58[0] = 0.5;
  }
  uVar2 = CONCAT44((int)((uint)(in1Type == INPUTTYPE_DYNAMIC) << 0x1f) >> 0x1f,
                   (int)((uint)(in1Type == INPUTTYPE_DYNAMIC) << 0x1f) >> 0x1f);
  local_28._0_8_ = ~uVar2 & DAT_00ae38e0 | *(ulong *)(evalCtx->coords).m_data & uVar2;
  outerProduct<float,2,3>
            ((Matrix<float,_3,_2> *)(local_28 + 8),(MatrixCaseUtils *)&local_60,
             (Vector<float,_3> *)local_28,in_RCX);
  local_58[4] = 0.0;
  local_58[2] = 0.0;
  local_58[3] = 0.0;
  lVar1 = 0;
  do {
    local_58[lVar1 + 2] = afStack_14[lVar1 + -3] + afStack_14[lVar1];
    lVar1 = lVar1 + 1;
  } while (lVar1 != 3);
  aiStack_40[2] = 0;
  aiStack_40[3] = 1;
  aiStack_40[4] = 2;
  lVar1 = 2;
  do {
    (evalCtx->color).m_data[aiStack_40[lVar1]] = local_58[lVar1];
    lVar1 = lVar1 + 1;
  } while (lVar1 != 5);
  return;
}

Assistant:

static void evaluate (ShaderEvalContext& evalCtx, InputType in0Type, InputType in1Type)
	{
		typename TypeTraits<In0DataType>::Type	in0	= (in0Type == INPUTTYPE_DYNAMIC) ? getInputValue<INPUTTYPE_DYNAMIC, In0DataType>(evalCtx, 0)
																				     : getInputValue<INPUTTYPE_CONST,	In0DataType>(evalCtx, 0);
		typename TypeTraits<In1DataType>::Type	in1	= (in1Type == INPUTTYPE_DYNAMIC) ? getInputValue<INPUTTYPE_DYNAMIC, In1DataType>(evalCtx, 1)
																				     : getInputValue<INPUTTYPE_CONST,	In1DataType>(evalCtx, 1);
		evalCtx.color.xyz() = reduceToVec3(outerProduct(in0, in1));
	}